

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     AssignmentOperatorHelper<true,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute<true>(View<int,_true,_std::allocator<unsigned_long>_> *from,
                    View<int,_true,_std::allocator<unsigned_long>_> *to)

{
  View<int,_true,_std::allocator<unsigned_long>_> *to_local;
  View<int,_true,_std::allocator<unsigned_long>_> *from_local;
  
  Assert<bool>(true);
  to->data_ = from->data_;
  Geometry<std::allocator<unsigned_long>_>::operator=(&to->geometry_,&from->geometry_);
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, isConstFrom, AFrom>& from,
        View<TTo, true, ATo>& to
    )
    {
        Assert(MARRAY_NO_ARG_TEST || sizeof(TFrom) == sizeof(TTo));
        to.data_ = static_cast<const TTo*>(
            static_cast<const void*>(from.data_)); // copy pointer
        to.geometry_ = from.geometry_;
    }